

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint __len;
  int iVar1;
  int iVar2;
  int extraout_EAX;
  FILE *fp;
  EVP_PKEY *pkey;
  char *pcVar3;
  quicly_stream_t *__stream;
  quicly_context_t *stream_00;
  quicly_stream_t *stream;
  quicly_conn_t *client;
  quicly_stream_open_t stream_open;
  ptls_openssl_sign_certificate_t sign_certificate;
  ptls_context_t tlsctx;
  sockaddr_storage sa;
  char *local_1e8;
  quicly_stream_t *local_1e0;
  undefined1 local_1d8 [112];
  ptls_context_t local_168;
  sockaddr local_b0 [8];
  
  memcpy(&local_168,&PTR_ptls_openssl_random_bytes_00137590,0xb8);
  local_1d8._56_8_ = on_stream_open;
  memcpy(&ctx,&quicly_spec_context,0x100);
  ctx.tls = &local_168;
  quicly_amend_ptls_context(&local_168);
  local_1e8 = "4433";
  ctx.stream_open = (quicly_stream_open_t *)(local_1d8 + 0x38);
  while( true ) {
    while (iVar1 = getopt(argc,argv,"c:k:p:h"), 0x67 < iVar1) {
      if (iVar1 == 0x6b) {
        fp = fopen(_optarg,"r");
        if (fp == (FILE *)0x0) goto LAB_001164af;
        pkey = PEM_read_PrivateKey(fp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
        fclose(fp);
        if (pkey == (EVP_PKEY *)0x0) goto LAB_001164b4;
        ptls_openssl_init_sign_certificate
                  ((ptls_openssl_sign_certificate_t *)(local_1d8 + 0x58),(EVP_PKEY *)pkey);
        EVP_PKEY_free(pkey);
        local_168.sign_certificate = (ptls_sign_certificate_t *)(local_1d8 + 0x58);
      }
      else {
        if (iVar1 != 0x70) {
          if (iVar1 == 0x68) {
            printf("Usage: %s [options] [host]\nOptions:\n  -c <file>    specifies the certificate chain file (PEM format)\n  -k <file>    specifies the private key file (PEM format)\n  -p <number>  specifies the port number (default: 4433)\n  -h           prints this help\n\nWhen both `-c` and `-k` is specified, runs as a server.  Otherwise, runs as a\nclient connecting to host:port.  If omitted, host defaults to 127.0.0.1.\n"
                   ,*argv);
            exit(0);
          }
          goto LAB_001164fd;
        }
        local_1e8 = _optarg;
      }
    }
    if (iVar1 != 99) break;
    iVar1 = ptls_load_certificates(&local_168,_optarg);
    if (iVar1 != 0) {
      main_cold_3();
LAB_001164af:
      main_cold_2();
LAB_001164b4:
      main_cold_1();
LAB_001164b9:
      main_cold_4();
      iVar1 = extraout_EAX;
LAB_001164be:
      __stream = _stderr;
      if (iVar1 == 0) {
LAB_001164dd:
        pcVar3 = "getaddrinfo returned NULL";
      }
      else {
        pcVar3 = gai_strerror(iVar1);
      }
      fprintf((FILE *)__stream,"failed to resolve address:%s:%s:%s\n",argv,local_1e8,pcVar3);
LAB_001164fd:
      exit(1);
    }
  }
  if (iVar1 != -1) goto LAB_001164fd;
  if (((ptls_openssl_sign_certificate_t *)local_168.sign_certificate ==
      (ptls_openssl_sign_certificate_t *)0x0) == (local_168.certificates.count != 0))
  goto LAB_001164b9;
  if (_optind == argc) {
    pcVar3 = "127.0.0.1";
  }
  else {
    pcVar3 = argv[_optind];
  }
  local_1d8._16_8_ = (quicly_stream_callbacks_t *)0x0;
  local_1d8._24_8_ = (sockaddr *)0x0;
  local_1d8._32_8_ = (char *)0x0;
  local_1d8._40_8_ = (addrinfo *)0x0;
  local_1d8._0_8_ = (quicly_conn_t *)0x200000421;
  local_1d8._8_8_ = 2;
  iVar1 = getaddrinfo(pcVar3,local_1e8,(addrinfo *)local_1d8,(addrinfo **)&local_1e0);
  argv = (char **)pcVar3;
  if ((iVar1 != 0) || (local_1e0 == (quicly_stream_t *)0x0)) goto LAB_001164be;
  __len = *(uint *)&local_1e0->callbacks;
  memcpy(local_b0,(local_1e0->sendstate).acked.ranges,(ulong)__len);
  freeaddrinfo((addrinfo *)local_1e0);
  iVar1 = socket((uint)local_b0[0].sa_family,2,0);
  if (iVar1 != -1) {
    if (((ctx.tls)->certificates).count == 0) {
LAB_001163e3:
      stream_00 = (quicly_context_t *)local_1d8;
      local_1d8._0_8_ = (quicly_conn_t *)0x0;
      local_1d8._8_8_ = 0;
      iVar2 = bind(iVar1,(sockaddr *)stream_00,0x10);
      if (iVar2 != 0) {
        main_cold_6();
        goto LAB_0011650c;
      }
    }
    else {
      local_1d8._0_4_ = 1;
      setsockopt(iVar1,1,2,local_1d8,4);
      iVar2 = bind(iVar1,local_b0,__len);
      if (iVar2 != 0) {
        main_cold_5();
        goto LAB_001163e3;
      }
    }
    local_1d8._0_8_ = (quicly_conn_t *)0x0;
    if (((ctx.tls)->certificates).count == 0) {
      local_1d8._64_8_ = (quicly_range_t *)0x0;
      local_1d8._72_8_ = 0;
      stream_00 = &ctx;
      iVar2 = quicly_connect((quicly_conn_t **)local_1d8,&ctx,pcVar3,(sockaddr *)local_b0,
                             (sockaddr *)0x0,&next_cid,(ptls_iovec_t)ZEXT816(0),
                             (ptls_handshake_properties_t *)0x0,(quicly_transport_parameters_t *)0x0
                            );
      if (iVar2 != 0) {
LAB_0011650c:
        main_cold_7();
        iVar1 = quicly_streambuf_create((quicly_stream_t *)stream_00,0x48);
        if (iVar1 == 0) {
          ((quicly_stream_t *)stream_00)->callbacks = &on_stream_open::stream_callbacks;
        }
        return iVar1;
      }
      quicly_open_stream((quicly_conn_t *)local_1d8._0_8_,&local_1e0,0);
    }
    iVar1 = run_loop(iVar1,(quicly_conn_t *)local_1d8._0_8_);
    return iVar1;
  }
  main_cold_8();
  __stream = local_1e0;
  goto LAB_001164dd;
}

Assistant:

int main(int argc, char **argv)
{
    ptls_openssl_sign_certificate_t sign_certificate;
    ptls_context_t tlsctx = {
        .random_bytes = ptls_openssl_random_bytes,
        .get_time = &ptls_get_time,
        .key_exchanges = ptls_openssl_key_exchanges,
        .cipher_suites = ptls_openssl_cipher_suites,
    };
    quicly_stream_open_t stream_open = {on_stream_open};
    char *host = "127.0.0.1", *port = "4433";
    struct sockaddr_storage sa;
    socklen_t salen;
    int ch, fd;

    /* setup quic context */
    ctx = quicly_spec_context;
    ctx.tls = &tlsctx;
    quicly_amend_ptls_context(ctx.tls);
    ctx.stream_open = &stream_open;

    /* resolve command line options and arguments */
    while ((ch = getopt(argc, argv, "c:k:p:h")) != -1) {
        switch (ch) {
        case 'c': /* load certificate chain */ {
            int ret;
            if ((ret = ptls_load_certificates(&tlsctx, optarg)) != 0) {
                fprintf(stderr, "failed to load certificates from file %s:%d\n", optarg, ret);
                exit(1);
            }
        } break;
        case 'k': /* load private key */ {
            FILE *fp;
            if ((fp = fopen(optarg, "r")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            EVP_PKEY *pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL);
            fclose(fp);
            if (pkey == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                exit(1);
            }
            ptls_openssl_init_sign_certificate(&sign_certificate, pkey);
            EVP_PKEY_free(pkey);
            tlsctx.sign_certificate = &sign_certificate.super;
        } break;
        case 'p': /* port */
            port = optarg;
            break;
        case 'h': /* help */
            usage(argv[0]);
            break;
        default:
            exit(1);
            break;
        }
    }
    if ((tlsctx.certificates.count != 0) != (tlsctx.sign_certificate != NULL)) {
        fprintf(stderr, "-c and -k options must be used together\n");
        exit(1);
    }
    argc -= optind;
    argv += optind;
    if (argc != 0)
        host = *argv++;
    if (resolve_address((struct sockaddr *)&sa, &salen, host, port, AF_INET, SOCK_DGRAM, 0) != 0)
        exit(1);

    /* open socket, on the specified port (as a server), or on any port (as a client) */
    if ((fd = socket(sa.ss_family, SOCK_DGRAM, 0)) == -1) {
        perror("socket(2) failed");
        exit(1);
    }
    // fcntl(fd, F_SETFL, O_NONBLOCK);
    if (is_server()) {
        int reuseaddr = 1;
        setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &reuseaddr, sizeof(reuseaddr));
        if (bind(fd, (struct sockaddr *)&sa, salen) != 0) {
            perror("bind(2) failed");
            exit(1);
        }
    } else {
        struct sockaddr_in local;
        memset(&local, 0, sizeof(local));
        if (bind(fd, (struct sockaddr *)&local, sizeof(local)) != 0) {
            perror("bind(2) failed");
            exit(1);
        }
    }

    quicly_conn_t *client = NULL;
    if (!is_server()) {
        /* initiate a connection, and open a stream */
        int ret;
        if ((ret = quicly_connect(&client, &ctx, host, (struct sockaddr *)&sa, NULL, &next_cid, ptls_iovec_init(NULL, 0), NULL,
                                  NULL)) != 0) {
            fprintf(stderr, "quicly_connect failed:%d\n", ret);
            exit(1);
        }
        quicly_stream_t *stream; /* we retain the opened stream via the on_stream_open callback */
        quicly_open_stream(client, &stream, 0);
    }

    /* enter the event loop with a connection object */
    return run_loop(fd, client);
}